

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa.c
# Opt level: O2

int IDAAGettnSolutionYp(IDAMem IDA_mem,N_Vector yp)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  if (IDA_mem->ida_nst != 0) {
    uVar3 = IDA_mem->ida_kused + (uint)(IDA_mem->ida_kused == 0);
    uVar2 = 0;
    uVar4 = 0;
    if (0 < (int)uVar3) {
      uVar4 = (ulong)uVar3;
    }
    dVar5 = 0.0;
    dVar8 = 0.0;
    dVar6 = 1.0;
    for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
      dVar5 = dVar5 * dVar8;
      dVar7 = dVar6 * dVar8;
      dVar8 = IDA_mem->ida_psi[uVar2] / IDA_mem->ida_psi[uVar2 + 1];
      dVar5 = dVar5 + dVar6 / IDA_mem->ida_psi[uVar2];
      IDA_mem->ida_dvals[uVar2] = dVar5;
      dVar6 = dVar7;
    }
    iVar1 = N_VLinearCombination(uVar3,IDA_mem->ida_dvals,IDA_mem->ida_phi + 1);
    return iVar1;
  }
  iVar1 = N_VScale(0x3ff0000000000000,IDA_mem->ida_phi[1],yp);
  return iVar1;
}

Assistant:

static int IDAAGettnSolutionYp(IDAMem IDA_mem, N_Vector yp)
{
  int j, kord, retval;
  sunrealtype C, D, gam;

  if (IDA_mem->ida_nst == 0)
  {
    /* If no integration was done, return the yp supplied by user.*/
    N_VScale(ONE, IDA_mem->ida_phi[1], yp);

    return (0);
  }

  /* Compute yp as in IDAGetSolution for this particular case when t=tn. */

  kord = IDA_mem->ida_kused;
  if (IDA_mem->ida_kused == 0) { kord = 1; }

  C   = ONE;
  D   = ZERO;
  gam = ZERO;
  for (j = 1; j <= kord; j++)
  {
    D   = D * gam + C / IDA_mem->ida_psi[j - 1];
    C   = C * gam;
    gam = IDA_mem->ida_psi[j - 1] / IDA_mem->ida_psi[j];

    IDA_mem->ida_dvals[j - 1] = D;
  }

  retval = N_VLinearCombination(kord, IDA_mem->ida_dvals, IDA_mem->ida_phi + 1,
                                yp);
  if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }

  return (0);
}